

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryCompileCommand.h
# Opt level: O2

cmCommand * __thiscall cmTryCompileCommand::Clone(cmTryCompileCommand *this)

{
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(0xb0);
  cmTryCompileCommand((cmTryCompileCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmTryCompileCommand; }